

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.hh
# Opt level: O3

void __thiscall OptionIndentIncrement::OptionIndentIncrement(OptionIndentIncrement *this)

{
  (this->super_ArchOption).name._M_dataplus._M_p = (pointer)&(this->super_ArchOption).name.field_2;
  (this->super_ArchOption).name._M_string_length = 0;
  (this->super_ArchOption).name.field_2._M_local_buf[0] = '\0';
  (this->super_ArchOption)._vptr_ArchOption = (_func_int **)&PTR_apply_003be3a0;
  std::__cxx11::string::_M_replace((ulong)&(this->super_ArchOption).name,0,(char *)0x0,0x340d6e);
  return;
}

Assistant:

OptionIndentIncrement(void) { name = "indentincrement"; }